

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

kTRContinueMode __thiscall
trun::TestResponseProxy::AssertError(TestResponseProxy *this,char *exp,char *file,int line)

{
  uint pLine;
  char *pcVar1;
  Config *pCVar2;
  bool bVar3;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  uint local_2c;
  char *pcStack_28;
  int line_local;
  char *file_local;
  char *exp_local;
  TestResponseProxy *this_local;
  
  local_2c = line;
  pcStack_28 = file;
  file_local = exp;
  exp_local = (char *)this;
  gnilk::Log::Debug<char_const*,char_const*,int,char_const*>
            (this->pLogger,"Assert Error: %s:%d\t\'%s\'",file,line,exp);
  printf("*** ASSERT ERROR: %s:%d\t\'%s\'\n",pcStack_28,(ulong)local_2c,file_local);
  pcVar1 = pcStack_28;
  pLine = local_2c;
  this->assertCount = this->assertCount + 1;
  if (this->testResult == kTestResult_Pass) {
    this->testResult = kTestResult_TestFail;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_51);
  pcVar1 = file_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
  trun::AssertError::Add(&this->assertError,kAssert_Error,pLine,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pCVar2 = Config::Instance();
  bVar3 = (pCVar2->continueOnAssert & 1U) == 0;
  if (bVar3) {
    TerminateThreadIfNeeded(this);
  }
  this_local._4_4_ = (kTRContinueMode)!bVar3;
  return this_local._4_4_;
}

Assistant:

kTRContinueMode TestResponseProxy::AssertError(const char *exp, const char *file, const int line) {
    pLogger->Debug("Assert Error: %s:%d\t'%s'", file, line, exp);
    printf("*** ASSERT ERROR: %s:%d\t'%s'\n", file, line, exp);

    this->assertCount++;
    if (testResult < kTestResult_TestFail) {
        testResult = kTestResult_TestFail;
    }
    assertError.Add(AssertError::kAssert_Error, line, file, exp);
    if (Config::Instance().continueOnAssert) {
        return kTRContinueMode::kTRContinue;
    }
    TerminateThreadIfNeeded();
    return kTRContinueMode::kTRLeave;
}